

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_compress4X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int flags)

{
  size_t sVar1;
  void *pvVar2;
  ulong srcSize_00;
  void *pvVar3;
  void *pvVar4;
  
  if (0xb < srcSize && 0x10 < dstSize) {
    if ((long)dstSize < 6) {
      __assert_fail("op <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3f5a,
                    "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                   );
    }
    srcSize_00 = srcSize + 3 >> 2;
    sVar1 = HUF_compress1X_usingCTable_internal
                      ((void *)((long)dst + 6),dstSize - 6,src,srcSize_00,CTable,flags);
    if (0xffffffffffffff88 < sVar1) {
      return sVar1;
    }
    if (0xffffffffffff0000 < sVar1 - 0x10000) {
      pvVar3 = (void *)(dstSize + (long)dst);
      *(short *)dst = (short)sVar1;
      pvVar4 = (void *)((long)dst + 6 + sVar1);
      if (pvVar3 < pvVar4) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3f62,
                      "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                     );
      }
      sVar1 = HUF_compress1X_usingCTable_internal
                        (pvVar4,(long)pvVar3 - (long)pvVar4,(void *)((long)src + srcSize_00),
                         srcSize_00,CTable,flags);
      if (0xffffffffffffff88 < sVar1) {
        return sVar1;
      }
      if (0xffffffffffff0000 < sVar1 - 0x10000) {
        *(short *)((long)dst + 2) = (short)sVar1;
        pvVar4 = (void *)((long)pvVar4 + sVar1);
        if (pvVar3 < pvVar4) {
          __assert_fail("op <= oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3f6a,
                        "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                       );
        }
        pvVar2 = (void *)((long)((long)src + srcSize_00) + srcSize_00);
        sVar1 = HUF_compress1X_usingCTable_internal
                          (pvVar4,(long)pvVar3 - (long)pvVar4,pvVar2,srcSize_00,CTable,flags);
        if (0xffffffffffffff88 < sVar1) {
          return sVar1;
        }
        if (0xffffffffffff0000 < sVar1 - 0x10000) {
          *(short *)((long)dst + 4) = (short)sVar1;
          pvVar4 = (void *)((long)pvVar4 + sVar1);
          if (pvVar3 < pvVar4) {
            __assert_fail("op <= oend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3f72,
                          "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                         );
          }
          pvVar2 = (void *)((long)pvVar2 + srcSize_00);
          if ((void *)((long)src + srcSize) < pvVar2) {
            __assert_fail("ip <= iend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3f73,
                          "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                         );
          }
          sVar1 = HUF_compress1X_usingCTable_internal
                            (pvVar4,(long)pvVar3 - (long)pvVar4,pvVar2,
                             (long)((long)src + srcSize) - (long)pvVar2,CTable,flags);
          if (0xffffffffffffff88 < sVar1) {
            return sVar1;
          }
          if (0xffffffffffff0000 < sVar1 - 0x10000) {
            return (long)pvVar4 + (sVar1 - (long)dst);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static size_t
HUF_compress4X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, int flags)
{
    size_t const segmentSize = (srcSize+3)/4;   /* first 3 segments */
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*) dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    if (dstSize < 6 + 1 + 1 + 1 + 8) return 0;   /* minimum space to compress successfully */
    if (srcSize < 12) return 0;   /* no saving possible : too small input */
    op += 6;   /* jumpTable */

    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+2, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+4, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    assert(ip <= iend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, (size_t)(iend-ip), CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        op += cSize;
    }

    return (size_t)(op-ostart);
}